

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *local_40;
  ImRect *local_38;
  ImGuiID local_2c;
  bool local_1;
  
  pIVar2 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    local_1 = false;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if (((GImGui->LastItemData).StatusFlags & 1U) == 0) {
      local_1 = false;
    }
    else {
      this = GImGui->HoveredWindowUnderMovingWindow;
      if (((this == (ImGuiWindow *)0x0) || (pIVar1->RootWindow != this->RootWindow)) ||
         ((pIVar1->SkipItems & 1U) != 0)) {
        local_1 = false;
      }
      else {
        if (((GImGui->LastItemData).StatusFlags & 2U) == 0) {
          local_38 = &(GImGui->LastItemData).Rect;
        }
        else {
          local_38 = &(GImGui->LastItemData).DisplayRect;
        }
        local_2c = (GImGui->LastItemData).ID;
        if (local_2c == 0) {
          local_2c = ImGuiWindow::GetIDFromRectangle(this,local_38);
          KeepAliveID(local_2c);
        }
        if ((pIVar2->DragDropPayload).SourceId == local_2c) {
          local_1 = false;
        }
        else {
          (pIVar2->DragDropTargetRect).Min = local_38->Min;
          (pIVar2->DragDropTargetRect).Max = local_38->Max;
          if (((pIVar2->LastItemData).StatusFlags & 0x200U) == 0) {
            local_40 = &pIVar1->ClipRect;
          }
          else {
            local_40 = &(pIVar2->LastItemData).ClipRect;
          }
          (pIVar2->DragDropTargetClipRect).Min = local_40->Min;
          (pIVar2->DragDropTargetClipRect).Max = local_40->Max;
          pIVar2->DragDropTargetId = local_2c;
          pIVar2->DragDropWithinTarget = true;
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
    {
        id = window->GetIDFromRectangle(display_rect);
        KeepAliveID(id);
    }
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false && g.DragDropWithinSource == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetClipRect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasClipRect) ? g.LastItemData.ClipRect : window->ClipRect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}